

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::(anonymous_namespace)::TokenizerTest_SimpleTokens_DD::
DoSingleCase<google::protobuf::io::(anonymous_namespace)::SimpleTokenCase,int>
          (TokenizerTest_SimpleTokens_DD *this,SimpleTokenCase *kSimpleTokenCases_case,
          int *kBlockSizes_case)

{
  bool bVar1;
  int size;
  void *data;
  Token *pTVar2;
  char *pcVar3;
  char *in_R9;
  string local_460;
  AssertHelper local_440;
  Message local_438;
  bool local_429;
  undefined1 local_428 [8];
  AssertionResult gtest_ar__2;
  Message local_410;
  unsigned_long local_408;
  undefined1 local_400 [8];
  AssertionResult gtest_ar_14;
  Message local_3e8;
  unsigned_long local_3e0;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_13;
  Message local_3c0;
  int local_3b4;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_12;
  Message local_398;
  undefined1 local_390 [8];
  AssertionResult gtest_ar_11;
  Message local_378;
  TokenType local_36c;
  undefined1 local_368 [8];
  AssertionResult gtest_ar_10;
  AssertHelper local_338;
  Message local_330;
  bool local_321;
  undefined1 local_320 [8];
  AssertionResult gtest_ar__1;
  Message local_308;
  unsigned_long local_300;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_9;
  Message local_2e0;
  int local_2d4;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_8;
  Message local_2b8;
  int local_2ac;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_7;
  Message local_290;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_6;
  Message local_270;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_5;
  string local_250;
  AssertHelper local_230;
  Message local_228;
  bool local_219;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_;
  Message local_200;
  int local_1f4;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_4;
  Message local_1d8;
  int local_1cc;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_3;
  Message local_1b0;
  int local_1a4;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_2;
  Message local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_1;
  Message local_168;
  TokenType local_15c;
  undefined1 local_158 [8];
  AssertionResult gtest_ar;
  Tokenizer tokenizer;
  undefined1 local_78 [8];
  TestErrorCollector error_collector;
  TestInputStream input;
  int *kBlockSizes_case_local;
  SimpleTokenCase *kSimpleTokenCases_case_local;
  TokenizerTest_SimpleTokens_DD *this_local;
  
  data = (void *)std::__cxx11::string::data();
  size = std::__cxx11::string::size();
  io::anon_unknown_0::TestInputStream::TestInputStream
            ((TestInputStream *)((long)&error_collector.text_.field_2 + 8),data,size,
             *kBlockSizes_case);
  io::anon_unknown_0::TestErrorCollector::TestErrorCollector((TestErrorCollector *)local_78);
  Tokenizer::Tokenizer
            ((Tokenizer *)&gtest_ar.message_,
             (ZeroCopyInputStream *)((long)&error_collector.text_.field_2 + 8),
             (ErrorCollector *)local_78);
  local_15c = TYPE_START;
  pTVar2 = Tokenizer::current((Tokenizer *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<google::protobuf::io::Tokenizer::TokenType,_google::protobuf::io::Tokenizer::TokenType,_nullptr>
            ((EqHelper *)local_158,"Tokenizer::TYPE_START","tokenizer.current().type",&local_15c,
             &pTVar2->type);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0xe9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  pTVar2 = Tokenizer::current((Tokenizer *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[1],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_180,"\"\"","tokenizer.current().text",
             (char (*) [1])(anon_var_dwarf_37cdd0 + 5),&pTVar2->text);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0xea,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  local_1a4 = 0;
  pTVar2 = Tokenizer::current((Tokenizer *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1a0,"0","tokenizer.current().line",&local_1a4,&pTVar2->line);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0xeb,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  local_1cc = 0;
  pTVar2 = Tokenizer::current((Tokenizer *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1c8,"0","tokenizer.current().column",&local_1cc,&pTVar2->column);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_1d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0xec,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  local_1f4 = 0;
  pTVar2 = Tokenizer::current((Tokenizer *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1f0,"0","tokenizer.current().end_column",&local_1f4,
             &pTVar2->end_column);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar1) {
    testing::Message::Message(&local_200);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0xed,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  local_219 = Tokenizer::Next((Tokenizer *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_218,&local_219,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar1) {
    testing::Message::Message(&local_228);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_250,(internal *)local_218,(AssertionResult *)"tokenizer.Next()","false","true"
               ,in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0xf0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_230,&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    std::__cxx11::string::~string((string *)&local_250);
    testing::Message::~Message(&local_228);
  }
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  if (gtest_ar_5.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    pTVar2 = Tokenizer::current((Tokenizer *)&gtest_ar.message_);
    testing::internal::EqHelper::
    Compare<google::protobuf::io::Tokenizer::TokenType,_google::protobuf::io::Tokenizer::TokenType,_nullptr>
              ((EqHelper *)local_268,"kSimpleTokenCases_case.type","tokenizer.current().type",
               &kSimpleTokenCases_case->type,&pTVar2->type);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
    if (!bVar1) {
      testing::Message::Message(&local_270);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                 ,0xf3,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_270);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
      testing::Message::~Message(&local_270);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
    pTVar2 = Tokenizer::current((Tokenizer *)&gtest_ar.message_);
    testing::internal::EqHelper::
    Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              ((EqHelper *)local_288,"kSimpleTokenCases_case.input","tokenizer.current().text",
               &kSimpleTokenCases_case->input,&pTVar2->text);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
    if (!bVar1) {
      testing::Message::Message(&local_290);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                 ,0xf5,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_290);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
      testing::Message::~Message(&local_290);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
    local_2ac = 0;
    pTVar2 = Tokenizer::current((Tokenizer *)&gtest_ar.message_);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_2a8,"0","tokenizer.current().line",&local_2ac,&pTVar2->line);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
    if (!bVar1) {
      testing::Message::Message(&local_2b8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                 ,0xf7,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_2b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
      testing::Message::~Message(&local_2b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
    local_2d4 = 0;
    pTVar2 = Tokenizer::current((Tokenizer *)&gtest_ar.message_);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_2d0,"0","tokenizer.current().column",&local_2d4,&pTVar2->column);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
    if (!bVar1) {
      testing::Message::Message(&local_2e0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                 ,0xf8,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_2e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
      testing::Message::~Message(&local_2e0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
    local_300 = std::__cxx11::string::size();
    pTVar2 = Tokenizer::current((Tokenizer *)&gtest_ar.message_);
    testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
              ((EqHelper *)local_2f8,"kSimpleTokenCases_case.input.size()",
               "tokenizer.current().end_column",&local_300,&pTVar2->end_column);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
    if (!bVar1) {
      testing::Message::Message(&local_308);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                 ,0xfa,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_308);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_308);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
    bVar1 = Tokenizer::Next((Tokenizer *)&gtest_ar.message_);
    local_321 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_320,&local_321,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
    if (!bVar1) {
      testing::Message::Message(&local_330);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_10.message_,(internal *)local_320,
                 (AssertionResult *)"tokenizer.Next()","true","false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_338,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                 ,0xfd,pcVar3);
      testing::internal::AssertHelper::operator=(&local_338,&local_330);
      testing::internal::AssertHelper::~AssertHelper(&local_338);
      std::__cxx11::string::~string((string *)&gtest_ar_10.message_);
      testing::Message::~Message(&local_330);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
    local_36c = TYPE_END;
    pTVar2 = Tokenizer::current((Tokenizer *)&gtest_ar.message_);
    testing::internal::EqHelper::
    Compare<google::protobuf::io::Tokenizer::TokenType,_google::protobuf::io::Tokenizer::TokenType,_nullptr>
              ((EqHelper *)local_368,"Tokenizer::TYPE_END","tokenizer.current().type",&local_36c,
               &pTVar2->type);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
    if (!bVar1) {
      testing::Message::Message(&local_378);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_368);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                 ,0x100,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_378);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
      testing::Message::~Message(&local_378);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
    pTVar2 = Tokenizer::current((Tokenizer *)&gtest_ar.message_);
    testing::internal::EqHelper::
    Compare<char[1],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              ((EqHelper *)local_390,"\"\"","tokenizer.current().text",
               (char (*) [1])(anon_var_dwarf_37cdd0 + 5),&pTVar2->text);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
    if (!bVar1) {
      testing::Message::Message(&local_398);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                 ,0x101,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_398);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
      testing::Message::~Message(&local_398);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
    local_3b4 = 0;
    pTVar2 = Tokenizer::current((Tokenizer *)&gtest_ar.message_);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_3b0,"0","tokenizer.current().line",&local_3b4,&pTVar2->line);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
    if (!bVar1) {
      testing::Message::Message(&local_3c0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                 ,0x102,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_3c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
      testing::Message::~Message(&local_3c0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
    local_3e0 = std::__cxx11::string::size();
    pTVar2 = Tokenizer::current((Tokenizer *)&gtest_ar.message_);
    testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
              ((EqHelper *)local_3d8,"kSimpleTokenCases_case.input.size()",
               "tokenizer.current().column",&local_3e0,&pTVar2->column);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
    if (!bVar1) {
      testing::Message::Message(&local_3e8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3d8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                 ,0x103,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_3e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
      testing::Message::~Message(&local_3e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
    local_408 = std::__cxx11::string::size();
    pTVar2 = Tokenizer::current((Tokenizer *)&gtest_ar.message_);
    testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
              ((EqHelper *)local_400,"kSimpleTokenCases_case.input.size()",
               "tokenizer.current().end_column",&local_408,&pTVar2->end_column);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_400);
    if (!bVar1) {
      testing::Message::Message(&local_410);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_400);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                 ,0x105,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_410);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_410);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
    local_429 = (bool)std::__cxx11::string::empty();
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_428,&local_429,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
    if (!bVar1) {
      testing::Message::Message(&local_438);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_460,(internal *)local_428,(AssertionResult *)"error_collector.text_.empty()"
                 ,"false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_440,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                 ,0x108,pcVar3);
      testing::internal::AssertHelper::operator=(&local_440,&local_438);
      testing::internal::AssertHelper::~AssertHelper(&local_440);
      std::__cxx11::string::~string((string *)&local_460);
      testing::Message::~Message(&local_438);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
    gtest_ar_5.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  Tokenizer::~Tokenizer((Tokenizer *)&gtest_ar.message_);
  io::anon_unknown_0::TestErrorCollector::~TestErrorCollector((TestErrorCollector *)local_78);
  io::anon_unknown_0::TestInputStream::~TestInputStream
            ((TestInputStream *)((long)&error_collector.text_.field_2 + 8));
  return;
}

Assistant:

TEST_2D(TokenizerTest, SimpleTokens, kSimpleTokenCases, kBlockSizes) {
  // Set up the tokenizer.
  TestInputStream input(kSimpleTokenCases_case.input.data(),
                        kSimpleTokenCases_case.input.size(), kBlockSizes_case);
  TestErrorCollector error_collector;
  Tokenizer tokenizer(&input, &error_collector);

  // Before Next() is called, the initial token should always be TYPE_START.
  EXPECT_EQ(Tokenizer::TYPE_START, tokenizer.current().type);
  EXPECT_EQ("", tokenizer.current().text);
  EXPECT_EQ(0, tokenizer.current().line);
  EXPECT_EQ(0, tokenizer.current().column);
  EXPECT_EQ(0, tokenizer.current().end_column);

  // Parse the token.
  ASSERT_TRUE(tokenizer.Next());

  // Check that it has the right type.
  EXPECT_EQ(kSimpleTokenCases_case.type, tokenizer.current().type);
  // Check that it contains the complete input text.
  EXPECT_EQ(kSimpleTokenCases_case.input, tokenizer.current().text);
  // Check that it is located at the beginning of the input
  EXPECT_EQ(0, tokenizer.current().line);
  EXPECT_EQ(0, tokenizer.current().column);
  EXPECT_EQ(kSimpleTokenCases_case.input.size(),
            tokenizer.current().end_column);

  // There should be no more input.
  EXPECT_FALSE(tokenizer.Next());

  // After Next() returns false, the token should have type TYPE_END.
  EXPECT_EQ(Tokenizer::TYPE_END, tokenizer.current().type);
  EXPECT_EQ("", tokenizer.current().text);
  EXPECT_EQ(0, tokenizer.current().line);
  EXPECT_EQ(kSimpleTokenCases_case.input.size(), tokenizer.current().column);
  EXPECT_EQ(kSimpleTokenCases_case.input.size(),
            tokenizer.current().end_column);

  // There should be no errors.
  EXPECT_TRUE(error_collector.text_.empty());
}